

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_>::
     init_instance(instance *inst,void *holder_ptr)

{
  byte *pbVar1;
  type_info *valueptr;
  byte bVar2;
  type_info *find_type;
  internals *piVar3;
  value_and_holder v_h;
  type_index local_60;
  value_and_holder local_58;
  instance *local_38;
  
  local_60._M_target = (type_info *)&sdf_tools::sdf::SdfBox::typeinfo;
  find_type = detail::get_type_info(&local_60,false);
  detail::instance::get_value_and_holder(&local_58,inst,find_type,true);
  if (((local_58.inst)->field_0x30 & 2) == 0) {
    bVar2 = ((local_58.inst)->field_1).nonsimple.status[local_58.index] & 2;
  }
  else {
    bVar2 = (byte)(local_58.inst)->field_0x30 >> 3 & 1;
  }
  if (bVar2 == 0) {
    valueptr = (type_info *)*local_58.vh;
    local_60._M_target = valueptr;
    local_38 = inst;
    piVar3 = detail::get_internals();
    std::
    _Hashtable<void_const*,std::pair<void_const*const,pybind11::detail::instance*>,std::allocator<std::pair<void_const*const,pybind11::detail::instance*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<void*&,pybind11::detail::instance*&>
              ((_Hashtable<void_const*,std::pair<void_const*const,pybind11::detail::instance*>,std::allocator<std::pair<void_const*const,pybind11::detail::instance*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&piVar3->registered_instances,0,&local_60,&local_38);
    if (((local_58.type)->field_0x90 & 2) == 0) {
      detail::traverse_offset_bases(valueptr,local_58.type,inst,detail::register_instance_impl);
    }
    if (((local_58.inst)->field_0x30 & 2) == 0) {
      pbVar1 = ((local_58.inst)->field_1).nonsimple.status + local_58.index;
      *pbVar1 = *pbVar1 | 2;
    }
    else {
      (local_58.inst)->field_0x30 = (local_58.inst)->field_0x30 | 8;
    }
  }
  init_holder(inst,&local_58,(holder_type *)holder_ptr,*local_58.vh);
  return;
}

Assistant:

static void init_instance(detail::instance *inst, const void *holder_ptr) {
        auto v_h = inst->get_value_and_holder(detail::get_type_info(typeid(type)));
        if (!v_h.instance_registered()) {
            register_instance(inst, v_h.value_ptr(), v_h.type);
            v_h.set_instance_registered();
        }
        init_holder(inst, v_h, (const holder_type *) holder_ptr, v_h.value_ptr<type>());
    }